

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

int lua_rawgeti(lua_State *L,int idx,lua_Integer n)

{
  int iVar1;
  Table *t_00;
  lua_Unsigned u;
  Table *h;
  lu_byte tag;
  Table *t;
  lua_Integer n_local;
  int idx_local;
  lua_State *L_local;
  
  t_00 = gettable(L,idx);
  if (n - 1U < (ulong)t_00->asize) {
    h._7_1_ = *(byte *)((long)t_00->array + n + 3);
    if ((h._7_1_ & 0xf) != 0) {
      *(byte *)((L->top).offset + 8) = h._7_1_;
      (((L->top).p)->val).value_ = t_00->array[-1 - (n - 1U)];
    }
  }
  else {
    h._7_1_ = luaH_getint(t_00,n,&((L->top).p)->val);
  }
  iVar1 = finishrawget(L,h._7_1_);
  return iVar1;
}

Assistant:

LUA_API int lua_rawgeti (lua_State *L, int idx, lua_Integer n) {
  Table *t;
  lu_byte tag;
  lua_lock(L);
  t = gettable(L, idx);
  luaH_fastgeti(t, n, s2v(L->top.p), tag);
  return finishrawget(L, tag);
}